

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O2

void TestPlusCompare(void)

{
  bool bVar1;
  uint uVar2;
  undefined1 uVar3;
  int in_R9D;
  Bignum c;
  Bignum b;
  Bignum a;
  
  a.used_bigits_ = 0;
  a.exponent_ = 0;
  b.used_bigits_ = 0;
  b.exponent_ = 0;
  c.used_bigits_ = 0;
  c.exponent_ = 0;
  double_conversion::Bignum::AssignUInt16(&a,1);
  double_conversion::Bignum::AssignUInt16(&b,0);
  double_conversion::Bignum::AssignUInt16(&c,1);
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  uVar3 = 0xf8;
  CheckEqualsHelper((char *)0x4a0,0xc166fe,(char *)0x0,0xc0c4f8,(char *)(ulong)uVar2,in_R9D);
  bVar1 = double_conversion::Bignum::PlusEqual(&a,&b,&c);
  CheckHelper((char *)0x4a1,0xc0c56d,(char *)(ulong)bVar1,(bool)uVar3);
  bVar1 = double_conversion::Bignum::PlusLessEqual(&a,&b,&c);
  CheckHelper((char *)0x4a2,0xc0c515,(char *)(ulong)bVar1,(bool)uVar3);
  bVar1 = double_conversion::Bignum::PlusLess(&a,&b,&c);
  CheckHelper((char *)0x4a3,0xc0c534,(char *)(ulong)!bVar1,(bool)uVar3);
  double_conversion::Bignum::AssignUInt16(&a,0);
  double_conversion::Bignum::AssignUInt16(&b,0);
  double_conversion::Bignum::AssignUInt16(&c,1);
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x4a8,0xc16068,(char *)0xffffffffffffffff,0xc0c4f8,(char *)(ulong)uVar2,
                    in_R9D);
  uVar2 = double_conversion::Bignum::PlusCompare(&c,&b,&a);
  uVar3 = 0x4f;
  CheckEqualsHelper((char *)0x4a9,0xc16020,(char *)0x1,0xc0c54f,(char *)(ulong)uVar2,in_R9D);
  bVar1 = double_conversion::Bignum::PlusEqual(&a,&b,&c);
  CheckHelper((char *)0x4aa,0xc0c56c,(char *)(ulong)!bVar1,(bool)uVar3);
  bVar1 = double_conversion::Bignum::PlusEqual(&c,&b,&a);
  CheckHelper((char *)0x4ab,0xc0c588,(char *)(ulong)!bVar1,(bool)uVar3);
  bVar1 = double_conversion::Bignum::PlusLessEqual(&a,&b,&c);
  CheckHelper((char *)0x4ac,0xc0c515,(char *)(ulong)bVar1,(bool)uVar3);
  bVar1 = double_conversion::Bignum::PlusLessEqual(&c,&b,&a);
  CheckHelper((char *)0x4ad,0xc0c5a4,(char *)(ulong)!bVar1,(bool)uVar3);
  bVar1 = double_conversion::Bignum::PlusLess(&a,&b,&c);
  CheckHelper((char *)0x4ae,0xc0c535,(char *)(ulong)bVar1,(bool)uVar3);
  bVar1 = double_conversion::Bignum::PlusLess(&c,&b,&a);
  CheckHelper((char *)0x4af,0xc0c5c4,(char *)(ulong)!bVar1,(bool)uVar3);
  AssignHexString(&a,"1234567890ABCDEF12345");
  double_conversion::Bignum::AssignUInt16(&b,1);
  AssignHexString(&c,"1234567890ABCDEF12345");
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x4b4,0xc16020,(char *)0x1,0xc0c4f8,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&a,"1234567890ABCDEF12344");
  double_conversion::Bignum::AssignUInt16(&b,1);
  AssignHexString(&c,"1234567890ABCDEF12345");
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x4b9,0xc166fe,(char *)0x0,0xc0c4f8,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&a,"1234567890");
  double_conversion::Bignum::ShiftLeft(&a,0x2c);
  AssignHexString(&b,"ABCDEF12345");
  AssignHexString(&c,"1234567890ABCDEF12345");
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x4bf,0xc166fe,(char *)0x0,0xc0c4f8,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&a,"1234567890");
  double_conversion::Bignum::ShiftLeft(&a,0x2c);
  AssignHexString(&b,"ABCDEF12344");
  AssignHexString(&c,"1234567890ABCDEF12345");
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x4c5,0xc16068,(char *)0xffffffffffffffff,0xc0c4f8,(char *)(ulong)uVar2,
                    in_R9D);
  AssignHexString(&a,"1234567890");
  double_conversion::Bignum::ShiftLeft(&a,0x2c);
  AssignHexString(&b,"ABCDEF12346");
  AssignHexString(&c,"1234567890ABCDEF12345");
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x4cb,0xc1c1d3,(char *)0x1,0xc0c4f8,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&a,"1234567891");
  double_conversion::Bignum::ShiftLeft(&a,0x2c);
  AssignHexString(&b,"ABCDEF12345");
  AssignHexString(&c,"1234567890ABCDEF12345");
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x4d1,0xc1c1d3,(char *)0x1,0xc0c4f8,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&a,"1234567889");
  double_conversion::Bignum::ShiftLeft(&a,0x2c);
  AssignHexString(&b,"ABCDEF12345");
  AssignHexString(&c,"1234567890ABCDEF12345");
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x4d7,0xc16068,(char *)0xffffffffffffffff,0xc0c4f8,(char *)(ulong)uVar2,
                    in_R9D);
  AssignHexString(&a,"1234567890");
  double_conversion::Bignum::ShiftLeft(&a,0x4c);
  AssignHexString(&b,"ABCDEF12345");
  double_conversion::Bignum::ShiftLeft(&b,0x20);
  AssignHexString(&c,"1234567890ABCDEF12345");
  double_conversion::Bignum::ShiftLeft(&c,0x20);
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x4df,0xc166fe,(char *)0x0,0xc0c4f8,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&a,"1234567890");
  double_conversion::Bignum::ShiftLeft(&a,0x4c);
  AssignHexString(&b,"ABCDEF12344");
  double_conversion::Bignum::ShiftLeft(&b,0x20);
  AssignHexString(&c,"1234567890ABCDEF12345");
  double_conversion::Bignum::ShiftLeft(&c,0x20);
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x4e7,0xc16068,(char *)0xffffffffffffffff,0xc0c4f8,(char *)(ulong)uVar2,
                    in_R9D);
  AssignHexString(&a,"1234567890");
  double_conversion::Bignum::ShiftLeft(&a,0x4c);
  AssignHexString(&b,"ABCDEF12346");
  double_conversion::Bignum::ShiftLeft(&b,0x20);
  AssignHexString(&c,"1234567890ABCDEF12345");
  double_conversion::Bignum::ShiftLeft(&c,0x20);
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x4ef,0xc1c1d3,(char *)0x1,0xc0c4f8,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&a,"1234567891");
  double_conversion::Bignum::ShiftLeft(&a,0x4c);
  AssignHexString(&b,"ABCDEF12345");
  double_conversion::Bignum::ShiftLeft(&b,0x20);
  AssignHexString(&c,"1234567890ABCDEF12345");
  double_conversion::Bignum::ShiftLeft(&c,0x20);
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x4f7,0xc1c1d3,(char *)0x1,0xc0c4f8,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&a,"1234567889");
  double_conversion::Bignum::ShiftLeft(&a,0x4c);
  AssignHexString(&b,"ABCDEF12345");
  double_conversion::Bignum::ShiftLeft(&b,0x20);
  AssignHexString(&c,"1234567890ABCDEF12345");
  double_conversion::Bignum::ShiftLeft(&c,0x20);
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x4ff,0xc16068,(char *)0xffffffffffffffff,0xc0c4f8,(char *)(ulong)uVar2,
                    in_R9D);
  AssignHexString(&a,"1234567890");
  double_conversion::Bignum::ShiftLeft(&a,0x4c);
  AssignHexString(&b,"ABCDEF12345");
  double_conversion::Bignum::ShiftLeft(&b,0x20);
  AssignHexString(&c,"1234567890ABCDEF1234500000000");
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x506,0xc166fe,(char *)0x0,0xc0c4f8,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&a,"1234567890");
  double_conversion::Bignum::ShiftLeft(&a,0x4c);
  AssignHexString(&b,"ABCDEF12344");
  double_conversion::Bignum::ShiftLeft(&b,0x20);
  AssignHexString(&c,"1234567890ABCDEF1234500000000");
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x50d,0xc16068,(char *)0xffffffffffffffff,0xc0c4f8,(char *)(ulong)uVar2,
                    in_R9D);
  AssignHexString(&a,"1234567890");
  double_conversion::Bignum::ShiftLeft(&a,0x4c);
  AssignHexString(&b,"ABCDEF12346");
  double_conversion::Bignum::ShiftLeft(&b,0x20);
  AssignHexString(&c,"1234567890ABCDEF1234500000000");
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x514,0xc1c1d3,(char *)0x1,0xc0c4f8,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&a,"1234567891");
  double_conversion::Bignum::ShiftLeft(&a,0x4c);
  AssignHexString(&b,"ABCDEF12345");
  double_conversion::Bignum::ShiftLeft(&b,0x20);
  AssignHexString(&c,"1234567890ABCDEF1234500000000");
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x51b,0xc1c1d3,(char *)0x1,0xc0c4f8,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&a,"1234567889");
  double_conversion::Bignum::ShiftLeft(&a,0x4c);
  AssignHexString(&b,"ABCDEF12345");
  double_conversion::Bignum::ShiftLeft(&b,0x20);
  AssignHexString(&c,"1234567890ABCDEF1234500000000");
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x522,0xc16068,(char *)0xffffffffffffffff,0xc0c4f8,(char *)(ulong)uVar2,
                    in_R9D);
  AssignHexString(&a,"1234567890");
  double_conversion::Bignum::ShiftLeft(&a,0x4c);
  AssignHexString(&b,"ABCDEF12345");
  AssignHexString(&c,"123456789000000000ABCDEF12345");
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x528,0xc166fe,(char *)0x0,0xc0c4f8,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&a,"1234567890");
  double_conversion::Bignum::ShiftLeft(&a,0x4c);
  AssignHexString(&b,"ABCDEF12346");
  AssignHexString(&c,"123456789000000000ABCDEF12345");
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x52e,0xc1c1d3,(char *)0x1,0xc0c4f8,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&a,"1234567890");
  double_conversion::Bignum::ShiftLeft(&a,0x4c);
  AssignHexString(&b,"ABCDEF12344");
  AssignHexString(&c,"123456789000000000ABCDEF12345");
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x534,0xc16068,(char *)0xffffffffffffffff,0xc0c4f8,(char *)(ulong)uVar2,
                    in_R9D);
  AssignHexString(&a,"1234567890");
  double_conversion::Bignum::ShiftLeft(&a,0x4c);
  AssignHexString(&b,"ABCDEF12345");
  double_conversion::Bignum::ShiftLeft(&b,0x10);
  AssignHexString(&c,"12345678900000ABCDEF123450000");
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x53b,0xc166fe,(char *)0x0,0xc0c4f8,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&a,"1234567890");
  double_conversion::Bignum::ShiftLeft(&a,0x4c);
  AssignHexString(&b,"ABCDEF12344");
  double_conversion::Bignum::ShiftLeft(&b,0x10);
  AssignHexString(&c,"12345678900000ABCDEF123450000");
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x542,0xc16068,(char *)0xffffffffffffffff,0xc0c4f8,(char *)(ulong)uVar2,
                    in_R9D);
  AssignHexString(&a,"1234567890");
  double_conversion::Bignum::ShiftLeft(&a,0x4c);
  AssignHexString(&b,"ABCDEF12345");
  double_conversion::Bignum::ShiftLeft(&b,0x10);
  AssignHexString(&c,"12345678900000ABCDEF123450001");
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x549,0xc16068,(char *)0xffffffffffffffff,0xc0c4f8,(char *)(ulong)uVar2,
                    in_R9D);
  AssignHexString(&a,"1234567890");
  double_conversion::Bignum::ShiftLeft(&a,0x4c);
  AssignHexString(&b,"ABCDEF12346");
  double_conversion::Bignum::ShiftLeft(&b,0x10);
  AssignHexString(&c,"12345678900000ABCDEF123450000");
  uVar2 = double_conversion::Bignum::PlusCompare(&a,&b,&c);
  CheckEqualsHelper((char *)0x550,0xc16020,(char *)0x1,0xc0c4f8,(char *)(ulong)uVar2,in_R9D);
  return;
}

Assistant:

TEST(PlusCompare) {
  Bignum a;
  Bignum b;
  Bignum c;
  a.AssignUInt16(1);
  b.AssignUInt16(0);
  c.AssignUInt16(1);
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));
  CHECK(Bignum::PlusEqual(a, b, c));
  CHECK(Bignum::PlusLessEqual(a, b, c));
  CHECK(!Bignum::PlusLess(a, b, c));

  a.AssignUInt16(0);
  b.AssignUInt16(0);
  c.AssignUInt16(1);
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));
  CHECK_EQ(+1, Bignum::PlusCompare(c, b, a));
  CHECK(!Bignum::PlusEqual(a, b, c));
  CHECK(!Bignum::PlusEqual(c, b, a));
  CHECK(Bignum::PlusLessEqual(a, b, c));
  CHECK(!Bignum::PlusLessEqual(c, b, a));
  CHECK(Bignum::PlusLess(a, b, c));
  CHECK(!Bignum::PlusLess(c, b, a));

  AssignHexString(&a, "1234567890ABCDEF12345");
  b.AssignUInt16(1);
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(+1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890ABCDEF12344");
  b.AssignUInt16(1);
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4);
  AssignHexString(&b, "ABCDEF12345");
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4);
  AssignHexString(&b, "ABCDEF12344");
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4);
  AssignHexString(&b, "ABCDEF12346");
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567891");
  a.ShiftLeft(11*4);
  AssignHexString(&b, "ABCDEF12345");
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567889");
  a.ShiftLeft(11*4);
  AssignHexString(&b, "ABCDEF12345");
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF12345");
  c.ShiftLeft(32);
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12344");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF12345");
  c.ShiftLeft(32);
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12346");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF12345");
  c.ShiftLeft(32);
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567891");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF12345");
  c.ShiftLeft(32);
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567889");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF12345");
  c.ShiftLeft(32);
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF1234500000000");
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12344");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF1234500000000");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12346");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF1234500000000");
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567891");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF1234500000000");
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567889");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF1234500000000");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  AssignHexString(&c, "123456789000000000ABCDEF12345");
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12346");
  AssignHexString(&c, "123456789000000000ABCDEF12345");
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12344");
  AssignHexString(&c, "123456789000000000ABCDEF12345");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(16);
  AssignHexString(&c, "12345678900000ABCDEF123450000");
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12344");
  b.ShiftLeft(16);
  AssignHexString(&c, "12345678900000ABCDEF123450000");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(16);
  AssignHexString(&c, "12345678900000ABCDEF123450001");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12346");
  b.ShiftLeft(16);
  AssignHexString(&c, "12345678900000ABCDEF123450000");
  CHECK_EQ(+1, Bignum::PlusCompare(a, b, c));
}